

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O1

void avro::
     codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
     ::encode(Encoder *e,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *b)

{
  ulong in_RAX;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  ulong uStack_28;
  
  uStack_28 = in_RAX;
  (*e->_vptr_Encoder[0x10])();
  if ((b->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    (*e->_vptr_Encoder[0x12])(e);
    p_Var1 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(b->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var1 != p_Var3) {
      do {
        (*e->_vptr_Encoder[0x13])(e);
        (*e->_vptr_Encoder[10])(e,p_Var1 + 1);
        uStack_28 = uStack_28 & 0xffffffffffffff;
        p_Var2 = *(_Base_ptr *)(p_Var1 + 2);
        if (p_Var1[2]._M_parent == *(_Base_ptr *)(p_Var1 + 2)) {
          p_Var2 = (_Base_ptr)((long)&uStack_28 + 7);
        }
        (*e->_vptr_Encoder[0xb])(e,p_Var2);
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
      } while ((_Rb_tree_header *)p_Var1 != p_Var3);
    }
  }
  (*e->_vptr_Encoder[0x11])(e);
  return;
}

Assistant:

static void encode(Encoder& e, const std::map<std::string, T>& b) {
        e.mapStart();
        if (! b.empty()) {
            e.setItemCount(b.size());
            for (typename std::map<std::string, T>::const_iterator
                it = b.begin();
                it != b.end(); ++it) {
                e.startItem();
                avro::encode(e, it->first);
                avro::encode(e, it->second);
            }
        }
        e.mapEnd();
    }